

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_METAL_M3X3(Context *ctx)

{
  size_t in_R8;
  char row2 [64];
  char row1 [64];
  char row0 [64];
  char src0 [64];
  char code [256];
  
  make_METAL_srcarg_string(ctx,0,7,src0,in_R8);
  make_METAL_srcarg_string(ctx,1,7,row0,in_R8);
  make_METAL_srcarg_string(ctx,2,7,row1,in_R8);
  make_METAL_srcarg_string(ctx,3,7,row2,in_R8);
  ctx->metal_need_header_geometric = 1;
  make_METAL_destarg_assign
            (ctx,code,0x100,"float3(dot(%s, %s), dot(%s, %s), dot(%s, %s))",src0,row0,src0,row1,src0
             ,row2);
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_METAL_M3X3(Context *ctx)
{
    char src0[64]; make_METAL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
    char row0[64]; make_METAL_srcarg_string_vec3(ctx, 1, row0, sizeof (row0));
    char row1[64]; make_METAL_srcarg_string_vec3(ctx, 2, row1, sizeof (row1));
    char row2[64]; make_METAL_srcarg_string_vec3(ctx, 3, row2, sizeof (row2));
    char code[256];
    ctx->metal_need_header_geometric = 1;
    make_METAL_destarg_assign(ctx, code, sizeof (code),
                                "float3(dot(%s, %s), dot(%s, %s), dot(%s, %s))",
                                src0, row0, src0, row1, src0, row2);
    output_line(ctx, "%s", code);
}